

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bin_io_text_write.cpp
# Opt level: O2

string * __thiscall
ritobin::io::write_text_abi_cxx11_
          (string *__return_storage_ptr__,io *this,Bin *bin,vector<char,_std::allocator<char>_> *out
          ,size_t indent_size)

{
  bool bVar1;
  BinTextWriter writer;
  BinTextWriter local_20;
  
  local_20.writer.ident_ = 0;
  local_20.writer.buffer_ = (vector<char,_std::allocator<char>_> *)bin;
  local_20.writer.indent_size_ = (size_t)out;
  bVar1 = text_write_impl::BinTextWriter::process_bin(&local_20,(Bin *)this);
  if (bVar1) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  else {
    text_write_impl::BinTextWriter::trace_error_abi_cxx11_(__return_storage_ptr__,&local_20);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string write_text(Bin const& bin, std::vector<char>& out, size_t indent_size) noexcept {
        BinTextWriter writer = { { out, indent_size } };
        if (!writer.process_bin(bin)) {
            return writer.trace_error();
        }
        return {};
    }